

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall Selector::updateListeners(Selector *this)

{
  bool bVar1;
  Thread *this_00;
  undefined8 *puVar2;
  
  this_00 = JHThread::Thread::GetCurrent();
  bVar1 = JHThread::Thread::operator==(this_00,&(this->mThread).super_Thread);
  if (bVar1) {
    this->mUpdateFds = true;
  }
  else if (this->mRunning == true) {
    puVar2 = (undefined8 *)
             operator_new(0x18,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                          ,0xb0);
    *(undefined4 *)(puVar2 + 1) = 0;
    *puVar2 = &PTR_onRefCountZero_0012fea8;
    *(undefined8 *)((long)puVar2 + 0xc) = 0xfffffffc;
    (*(this->super_EventDispatcher).super_IEventDispatcher._vptr_IEventDispatcher[1])(this,puVar2);
    Condition::Wait(&this->mCondition,&this->mLock);
    return;
  }
  return;
}

Assistant:

void Selector::updateListeners()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	// if called from the selector, just set a flag to update the Fds list
	// otherwise send an event to update the Fds.  But we also need to wait
	// for this change to be made effective.  Otherwise we could get events
	// for old Fd on a new listener if the same Fd was used for the new file.
	if ( *Thread::GetCurrent() == mThread )
	{
		mUpdateFds = true;
	}
	else if ( mRunning )
	{
		Event *ev = jh_new Event( Event::kSelectorUpdateEventId );
		sendEvent( ev );
		mCondition.Wait( mLock );
	}
	// else threadMain has exited or is exiting so no nothing we are ending.
}